

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STInteger.cpp
# Opt level: O0

string * __thiscall
jbcoin::STInteger<unsigned_short>::getText_abi_cxx11_
          (string *__return_storage_ptr__,STInteger<unsigned_short> *this)

{
  bool bVar1;
  SField *pSVar2;
  KnownFormats<jbcoin::LedgerEntryType> *this_00;
  Item *this_01;
  KnownFormats<jbcoin::TxType> *this_02;
  Item *this_03;
  string *psVar3;
  unsigned_short extraout_DX;
  unsigned_short extraout_DX_00;
  unsigned_short in;
  Item *item_1;
  Item *item;
  STInteger<unsigned_short> *this_local;
  
  pSVar2 = STBase::getFName(&this->super_STBase);
  bVar1 = SField::operator==(pSVar2,(SField *)sfLedgerEntryType);
  if (bVar1) {
    this_00 = &LedgerFormats::getInstance()->super_KnownFormats<jbcoin::LedgerEntryType>;
    this_01 = KnownFormats<jbcoin::LedgerEntryType>::findByType(this_00,(uint)this->value_);
    if (this_01 != (Item *)0x0) {
      psVar3 = KnownFormats<jbcoin::LedgerEntryType>::Item::getName_abi_cxx11_(this_01);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
      return __return_storage_ptr__;
    }
  }
  pSVar2 = STBase::getFName(&this->super_STBase);
  bVar1 = SField::operator==(pSVar2,(SField *)sfTransactionType);
  in = extraout_DX;
  if (bVar1) {
    this_02 = &TxFormats::getInstance()->super_KnownFormats<jbcoin::TxType>;
    this_03 = KnownFormats<jbcoin::TxType>::findByType(this_02,(uint)this->value_);
    in = extraout_DX_00;
    if (this_03 != (Item *)0x0) {
      psVar3 = KnownFormats<jbcoin::TxType>::Item::getName_abi_cxx11_(this_03);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
      return __return_storage_ptr__;
    }
  }
  beast::lexicalCastThrow<std::__cxx11::string,unsigned_short>
            (__return_storage_ptr__,(beast *)(ulong)this->value_,in);
  return __return_storage_ptr__;
}

Assistant:

std::string
STUInt16::getText () const
{
    if (getFName () == sfLedgerEntryType)
    {
        auto item = LedgerFormats::getInstance ().findByType (
            static_cast <LedgerEntryType> (value_));

        if (item != nullptr)
            return item->getName ();
    }

    if (getFName () == sfTransactionType)
    {
        auto item =TxFormats::getInstance().findByType (
            static_cast <TxType> (value_));

        if (item != nullptr)
            return item->getName ();
    }

    return beast::lexicalCastThrow <std::string> (value_);
}